

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLVersionParser.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::VersionParser::parse15
          (VersionParser *this,ParserChar *elementName,ParserAttributes *attributes)

{
  bool bVar1;
  int iVar2;
  IParserImpl *parserImpl;
  StackFrame *pSVar3;
  SaxParserErrorHandler *this_00;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Parser *in_RDI;
  RootParser15 *rootParser;
  FileLoader *in_stack_ffffffffffffffa8;
  RootParser15 *in_stack_ffffffffffffffb0;
  Parser *parser;
  Parser *impl;
  
  createFunctionMap15((VersionParser *)0x7976a2);
  parserImpl = (IParserImpl *)operator_new(0x28);
  RootParser15::RootParser15(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  IFilePartLoader::setParserImpl((IFilePartLoader *)in_RDI[5].mErrorHandler,parserImpl);
  pSVar3 = (StackFrame *)operator_new(0x1f0);
  parser = (Parser *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    parser = (Parser *)(parserImpl + 1);
  }
  impl = parser;
  this_00 = DocumentProcessor::getErrorHandler((DocumentProcessor *)in_RDI[5].mErrorHandler);
  COLLADASaxFWL15::ColladaParserAutoGen15Private::ColladaParserAutoGen15Private
            ((ColladaParserAutoGen15Private *)in_RDI,(ColladaParserAutoGen15 *)impl,
             (IErrorHandler *)parserImpl);
  in_RDI[5].mSaxParser = (SaxParser *)pSVar3;
  FileLoader::setPrivateParser
            ((FileLoader *)in_RDI[5].mErrorHandler,
             (ColladaParserAutoGen15Private *)in_RDI[5].mSaxParser);
  GeneratedSaxParser::
  ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
  ::registerUnknownElementHandler
            ((ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
              *)in_RDI[5].mSaxParser,(IUnknownElementHandler *)(in_RDI[5].mErrorHandler + 0x10));
  bVar1 = std::
          map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
          ::empty((map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                   *)0x7977a5);
  if (!bVar1) {
    GeneratedSaxParser::
    ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
    ::setElementFunctionMap
              ((ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                *)in_RDI[5].mSaxParser,(ElementFunctionMap *)(in_RDI + 3));
  }
  GeneratedSaxParser::Parser::getSaxParser(in_RDI);
  GeneratedSaxParser::SaxParser::setParser((SaxParser *)this_00,parser);
  iVar2 = (*(in_RDI[5].mSaxParser)->_vptr_SaxParser[2])(in_RDI[5].mSaxParser,in_RSI,in_RDX);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool VersionParser::parse15( const ParserChar* elementName, const ParserAttributes& attributes )
    {
        createFunctionMap15();

        // note: rootParser is created with new because it is deleted in IFilePartLoader::~IFilePartLoader()
        RootParser15* rootParser = new RootParser15( mFileLoader );
        mFileLoader->setParserImpl( rootParser );
        mPrivateParser15 = new COLLADASaxFWL15::ColladaParserAutoGen15Private( rootParser, (GeneratedSaxParser::IErrorHandler*)mFileLoader->getErrorHandler() );
        mFileLoader->setPrivateParser( mPrivateParser15 );

        //privateParser.setCallbackObject( &rootParser );
		mPrivateParser15->registerUnknownElementHandler( &mFileLoader->mExtraDataElementHandler );

        if ( !mFunctionMap15.empty() )
        {
            mPrivateParser15->setElementFunctionMap( &mFunctionMap15 );
        }

        getSaxParser()->setParser( mPrivateParser15 );

        return mPrivateParser15->elementBegin( elementName, attributes );
    }